

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  Token *token;
  undefined1 local_80 [8];
  LocationRecorder location_2;
  LocationRecorder location_1;
  undefined1 local_50 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *root_location_local;
  RepeatedField<int> *weak_dependency_local;
  RepeatedField<int> *public_dependency_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = Consume(this,"import");
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_004bd1a1;
  }
  bVar1 = LookingAt(this,"public");
  if (bVar1) {
    iVar2 = RepeatedField<int>::size(public_dependency);
    LocationRecorder::LocationRecorder((LocationRecorder *)local_50,root_location,10,iVar2);
    bVar1 = Consume(this,"public");
    if (bVar1) {
      iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(dependency);
      piVar3 = RepeatedField<int>::Add(public_dependency);
      *piVar3 = iVar2;
    }
    else {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_50);
joined_r0x004bcfa0:
    if (!bVar1) goto LAB_004bd1a1;
  }
  else {
    bVar1 = LookingAt(this,"weak");
    if (bVar1) {
      iVar2 = RepeatedField<int>::size(weak_dependency);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&location_2.location_,root_location,0xb,iVar2);
      bVar1 = Consume(this,"weak");
      if (bVar1) {
        iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size(dependency);
        piVar3 = RepeatedField<int>::Add(weak_dependency);
        *piVar3 = iVar2;
      }
      else {
        this_local._7_1_ = 0;
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
      goto joined_r0x004bcfa0;
    }
  }
  iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(dependency);
  LocationRecorder::LocationRecorder((LocationRecorder *)local_80,root_location,3,iVar2);
  output = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(dependency);
  bVar1 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar1) {
    token = io::Tokenizer::previous(this->input_);
    LocationRecorder::EndAt((LocationRecorder *)local_80,token);
    bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)local_80);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
  }
  else {
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_80);
  if (!bVar1) {
    this_local._7_1_ = 1;
  }
LAB_004bd1a1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}